

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

string * __thiscall
cmGlobalGenerator::SelectMakeProgram
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *inMakeProgram,
          string *makeDefault)

{
  pointer pcVar1;
  cmake *this_00;
  char *pcVar2;
  bool bVar3;
  char *val;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (inMakeProgram->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + inMakeProgram->_M_string_length);
  bVar3 = cmSystemTools::IsOff(__return_storage_ptr__);
  if (bVar3) {
    this_00 = this->CMakeInstance;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CMAKE_MAKE_PROGRAM","");
    val = cmake::GetCacheDefinition(this_00,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    bVar3 = cmSystemTools::IsOff(val);
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
    else {
      pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(val);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)val);
    }
    bVar3 = cmSystemTools::IsOff(__return_storage_ptr__);
    if ((bVar3) && ((char *)__return_storage_ptr__->_M_string_length != (char *)0x0)) {
      std::__cxx11::string::_M_replace
                ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                 0x4dd9d8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::SelectMakeProgram(
  const std::string& inMakeProgram, const std::string& makeDefault) const
{
  std::string makeProgram = inMakeProgram;
  if (cmSystemTools::IsOff(makeProgram)) {
    const char* makeProgramCSTR =
      this->CMakeInstance->GetCacheDefinition("CMAKE_MAKE_PROGRAM");
    if (cmSystemTools::IsOff(makeProgramCSTR)) {
      makeProgram = makeDefault;
    } else {
      makeProgram = makeProgramCSTR;
    }
    if (cmSystemTools::IsOff(makeProgram) && !makeProgram.empty()) {
      makeProgram = "CMAKE_MAKE_PROGRAM-NOTFOUND";
    }
  }
  return makeProgram;
}